

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_extract.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::ListExtractStats(duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  reference stats;
  BaseStatistics *this_00;
  BaseStatistics child_copy;
  BaseStatistics BStack_68;
  
  stats = vector<duckdb::BaseStatistics,_true>::operator[](input->child_stats,0);
  this_00 = ListStats::GetChildStats(stats);
  BaseStatistics::Copy(&BStack_68,this_00);
  BaseStatistics::Set(&BStack_68,CAN_HAVE_NULL_VALUES);
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&BStack_68);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> ListExtractStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &list_child_stats = ListStats::GetChildStats(child_stats[0]);
	auto child_copy = list_child_stats.Copy();
	// list_extract always pushes a NULL, since if the offset is out of range for a list it inserts a null
	child_copy.Set(StatsInfo::CAN_HAVE_NULL_VALUES);
	return child_copy.ToUnique();
}